

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O3

array<unsigned_long,_2UL> __thiscall Omega_h::Overlay::get_face_cells(Overlay *this,size_t face)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  array<unsigned_long,_2UL> aVar5;
  array<unsigned_long,_2UL> cells;
  Adj faces2cells;
  _Type local_50;
  Adj local_40;
  
  Omega_h::Mesh::get_adj(&local_40,&this->mesh,2,3);
  iVar1 = *(int *)((long)local_40.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                  ((long)(face << 0x20) >> 0x1e));
  lVar2 = (long)*(int *)((long)local_40.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                        ((long)((face << 0x20) + 0x100000000) >> 0x1e)) - (long)iVar1;
  if (lVar2 != 0) {
    lVar3 = 0;
    do {
      local_50[lVar3] =
           (long)*(int *)((long)local_40.super_Graph.ab2b.write_.shared_alloc_.direct_ptr +
                         (long)(iVar1 + (int)lVar3) * 4);
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    if (lVar2 != 1) goto LAB_0044185d;
  }
  do {
    local_50[lVar2] = 0xffffffffffffffff;
    bVar4 = lVar2 == 0;
    lVar2 = 1;
  } while (bVar4);
LAB_0044185d:
  Adj::~Adj(&local_40);
  aVar5._M_elems[0] = local_50[0];
  aVar5._M_elems[1] = local_50[1];
  return (array<unsigned_long,_2UL>)aVar5._M_elems;
}

Assistant:

std::array<size_t, 2> Overlay::get_face_cells(size_t face) const {
  std::array<size_t, 2> cells;
  auto faces2cells = mesh.get_adj(FACE, REGION);
  auto face_i = LO(face);
  auto begin_i = size_t(faces2cells.a2ab[face_i]);
  auto ncells = size_t(faces2cells.a2ab[face_i + 1]) - begin_i;
  for (size_t i = 0; i < ncells; ++i) {
    cells[i] = size_t(faces2cells.ab2b[LO(begin_i + i)]);
  }
  for (size_t i = ncells; i < 2; ++i) {
    cells[i] = get_invalid_cell_handle();
  }
  return cells;
}